

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersector1<4,_1,_true,_embree::sse42::ArrayIntersector1<embree::sse42::TriangleMiIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined8 *puVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  undefined8 uVar14;
  float **ppfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  Geometry *pGVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 (*pauVar25) [16];
  int iVar26;
  undefined4 uVar27;
  undefined1 (*pauVar28) [16];
  long lVar29;
  RayHit *pRVar31;
  ulong uVar32;
  RTCRayQueryContext *pRVar33;
  uint uVar34;
  ulong uVar35;
  RayHit *pRVar36;
  ulong uVar37;
  RayQueryContext *pRVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar62;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar63;
  float fVar69;
  float fVar71;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar70;
  float fVar72;
  undefined1 auVar68 [16];
  float fVar73;
  float fVar78;
  float fVar79;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar80;
  undefined1 auVar77 [16];
  float fVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar88;
  float fVar92;
  float fVar93;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar94;
  undefined1 auVar91 [16];
  float fVar95;
  float fVar98;
  float fVar99;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar100;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  undefined1 auVar101 [16];
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  undefined1 auVar129 [16];
  float fVar135;
  float fVar137;
  float fVar138;
  float fVar139;
  undefined1 auVar136 [16];
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  UVIdentity<4> mapUV;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1269;
  ulong local_1268;
  ulong local_1260;
  undefined8 local_1258;
  float fStack_1250;
  float fStack_124c;
  undefined1 local_1248 [16];
  long local_1230;
  undefined1 local_1228 [16];
  RayHit *local_1210;
  RayQueryContext *local_1208;
  undefined1 local_11fc [4];
  undefined1 local_11f8 [16];
  undefined1 local_11e8 [16];
  RTCFilterFunctionNArguments local_11d8;
  float local_11a8;
  float fStack_11a4;
  float fStack_11a0;
  float fStack_119c;
  undefined1 local_1198 [8];
  float fStack_1190;
  float fStack_118c;
  undefined8 local_1188;
  float fStack_1180;
  float fStack_117c;
  long local_1178;
  Scene *local_1170;
  float local_1168;
  undefined4 local_1164;
  undefined4 local_1160;
  undefined4 local_115c;
  undefined4 local_1158;
  undefined4 local_1154;
  uint local_1150;
  uint local_114c;
  uint local_1148;
  float local_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  float local_1128;
  float fStack_1124;
  float fStack_1120;
  float fStack_111c;
  undefined8 local_1118;
  undefined8 uStack_1110;
  undefined1 local_1108 [12];
  float fStack_10fc;
  float local_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  undefined1 local_10e8 [16];
  undefined1 *local_10d8;
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  uint local_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  undefined1 local_fc8 [16];
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  undefined8 local_f88;
  undefined8 uStack_f80;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  ulong uVar30;
  float fVar58;
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    pauVar28 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    fVar134 = (ray->super_RayK<1>).org.field_0.m128[0];
    fVar62 = (ray->super_RayK<1>).org.field_0.m128[1];
    fVar81 = (ray->super_RayK<1>).org.field_0.m128[2];
    fVar114 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    aVar10 = (ray->super_RayK<1>).dir.field_0.field_1;
    fVar143 = (ray->super_RayK<1>).tfar;
    fVar80 = 0.0;
    if (0.0 <= fVar143) {
      fVar80 = fVar143;
    }
    auVar118._4_4_ = -(uint)(ABS(aVar10.y) < 1e-18);
    auVar118._0_4_ = -(uint)(ABS(aVar10.x) < 1e-18);
    auVar118._8_4_ = -(uint)(ABS(aVar10.z) < 1e-18);
    auVar118._12_4_ = -(uint)(ABS(aVar10.field_3.w) < 1e-18);
    fVar143 = 0.0;
    if (0.0 <= fVar114) {
      fVar143 = fVar114;
    }
    auVar117 = divps(_DAT_01f7ba10,(undefined1  [16])aVar10);
    auVar118 = blendvps(auVar117,_DAT_01fab950,auVar118);
    fVar127 = auVar118._0_4_ * 0.99999964;
    fVar130 = auVar118._4_4_ * 0.99999964;
    fVar132 = auVar118._8_4_ * 0.99999964;
    fVar114 = auVar118._0_4_ * 1.0000004;
    fVar119 = auVar118._4_4_ * 1.0000004;
    fVar122 = auVar118._8_4_ * 1.0000004;
    uVar30 = (ulong)(fVar127 < 0.0) << 4;
    uVar37 = (ulong)(fVar130 < 0.0) << 4 | 0x20;
    uVar41 = (ulong)(fVar132 < 0.0) << 4 | 0x40;
    uVar39 = uVar30 ^ 0x10;
    uVar40 = uVar37 ^ 0x10;
    auVar117._4_4_ = fVar80;
    auVar117._0_4_ = fVar80;
    auVar117._8_4_ = fVar80;
    auVar117._12_4_ = fVar80;
    _local_fd8 = mm_lookupmask_ps._240_8_;
    _uStack_fd0 = mm_lookupmask_ps._248_8_;
    local_fe8 = fVar81;
    fStack_fe4 = fVar81;
    fStack_fe0 = fVar81;
    fStack_fdc = fVar81;
    local_ff8 = fVar143;
    fStack_ff4 = fVar143;
    fStack_ff0 = fVar143;
    fStack_fec = fVar143;
    local_1008 = fVar122;
    fStack_1004 = fVar122;
    fStack_1000 = fVar122;
    fStack_ffc = fVar122;
    local_1018 = fVar132;
    fStack_1014 = fVar132;
    fStack_1010 = fVar132;
    fStack_100c = fVar132;
    local_1028 = fVar134;
    fStack_1024 = fVar134;
    fStack_1020 = fVar134;
    fStack_101c = fVar134;
    local_1038 = fVar62;
    fStack_1034 = fVar62;
    fStack_1030 = fVar62;
    fStack_102c = fVar62;
    local_1048 = fVar127;
    fStack_1044 = fVar127;
    fStack_1040 = fVar127;
    fStack_103c = fVar127;
    local_1058 = fVar130;
    fStack_1054 = fVar130;
    fStack_1050 = fVar130;
    fStack_104c = fVar130;
    local_1128 = fVar114;
    fStack_1124 = fVar114;
    fStack_1120 = fVar114;
    fStack_111c = fVar114;
    local_1138 = fVar119;
    fStack_1134 = fVar119;
    fStack_1130 = fVar119;
    fStack_112c = fVar119;
    fVar80 = fVar114;
    fVar58 = fVar114;
    fVar63 = fVar114;
    fVar69 = fVar119;
    fVar70 = fVar119;
    fVar71 = fVar119;
    local_1208 = context;
    local_1210 = ray;
    local_1260 = uVar30;
    local_1268 = uVar37;
    fVar113 = fVar134;
    fVar112 = fVar134;
    fVar111 = fVar134;
    fVar110 = fVar132;
    fVar109 = fVar132;
    fVar108 = fVar132;
    fVar107 = fVar122;
    fVar106 = fVar122;
    fVar105 = fVar122;
    fVar104 = fVar81;
    fVar103 = fVar81;
    fVar102 = fVar81;
    fVar100 = fVar130;
    fVar99 = fVar130;
    fVar98 = fVar130;
    fVar95 = fVar127;
    fVar94 = fVar127;
    fVar93 = fVar127;
    fVar92 = fVar62;
    fVar88 = fVar62;
    fVar79 = fVar62;
    fVar78 = fVar143;
    fVar73 = fVar143;
    fVar72 = fVar143;
    pRVar38 = context;
LAB_00d9060e:
    do {
      pauVar25 = pauVar28 + -1;
      pauVar28 = pauVar28 + -1;
      pfVar8 = &(ray->super_RayK<1>).tfar;
      if (*(float *)((long)*pauVar25 + 8) < *pfVar8 || *(float *)((long)*pauVar25 + 8) == *pfVar8) {
        uVar35 = *(ulong *)*pauVar28;
        while ((uVar35 & 8) == 0) {
          pfVar8 = (float *)(uVar35 + 0x20 + uVar30);
          auVar84._0_4_ = (*pfVar8 - fVar111) * fVar93;
          auVar84._4_4_ = (pfVar8[1] - fVar112) * fVar94;
          auVar84._8_4_ = (pfVar8[2] - fVar113) * fVar95;
          auVar84._12_4_ = (pfVar8[3] - fVar134) * fVar127;
          pfVar8 = (float *)(uVar35 + 0x20 + uVar37);
          auVar90._0_4_ = (*pfVar8 - fVar79) * fVar98;
          auVar90._4_4_ = (pfVar8[1] - fVar88) * fVar99;
          auVar90._8_4_ = (pfVar8[2] - fVar92) * fVar100;
          auVar90._12_4_ = (pfVar8[3] - fVar62) * fVar130;
          auVar118 = maxps(auVar84,auVar90);
          pfVar8 = (float *)(uVar35 + 0x20 + uVar41);
          auVar64._0_4_ = (*pfVar8 - fVar102) * fVar108;
          auVar64._4_4_ = (pfVar8[1] - fVar103) * fVar109;
          auVar64._8_4_ = (pfVar8[2] - fVar104) * fVar110;
          auVar64._12_4_ = (pfVar8[3] - fVar81) * fVar132;
          auVar65._4_4_ = fVar73;
          auVar65._0_4_ = fVar72;
          auVar65._8_4_ = fVar78;
          auVar65._12_4_ = fVar143;
          auVar65 = maxps(auVar64,auVar65);
          _local_1108 = maxps(auVar118,auVar65);
          pfVar8 = (float *)(uVar35 + 0x20 + uVar39);
          auVar66._0_4_ = (*pfVar8 - fVar111) * fVar114;
          auVar66._4_4_ = (pfVar8[1] - fVar112) * fVar80;
          auVar66._8_4_ = (pfVar8[2] - fVar113) * fVar58;
          auVar66._12_4_ = (pfVar8[3] - fVar134) * fVar63;
          pfVar8 = (float *)(uVar35 + 0x20 + uVar40);
          auVar74._0_4_ = (*pfVar8 - fVar79) * fVar119;
          auVar74._4_4_ = (pfVar8[1] - fVar88) * fVar69;
          auVar74._8_4_ = (pfVar8[2] - fVar92) * fVar70;
          auVar74._12_4_ = (pfVar8[3] - fVar62) * fVar71;
          auVar118 = minps(auVar66,auVar74);
          pfVar8 = (float *)(uVar35 + 0x20 + (uVar41 ^ 0x10));
          auVar75._0_4_ = (*pfVar8 - fVar102) * fVar105;
          auVar75._4_4_ = (pfVar8[1] - fVar103) * fVar106;
          auVar75._8_4_ = (pfVar8[2] - fVar104) * fVar107;
          auVar75._12_4_ = (pfVar8[3] - fVar81) * fVar122;
          auVar65 = minps(auVar75,auVar117);
          auVar118 = minps(auVar118,auVar65);
          auVar86._4_4_ = -(uint)(local_1108._4_4_ <= auVar118._4_4_);
          auVar86._0_4_ = -(uint)(local_1108._0_4_ <= auVar118._0_4_);
          auVar86._8_4_ = -(uint)(local_1108._8_4_ <= auVar118._8_4_);
          auVar86._12_4_ = -(uint)(local_1108._12_4_ <= auVar118._12_4_);
          uVar34 = movmskps((int)context,auVar86);
          context = (RayQueryContext *)(ulong)uVar34;
          if (uVar34 == 0) {
            if (pauVar28 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            goto LAB_00d9060e;
          }
          uVar32 = uVar35 & 0xfffffffffffffff0;
          context = (RayQueryContext *)0x0;
          if ((byte)uVar34 != 0) {
            for (; ((byte)uVar34 >> (long)context & 1) == 0;
                context = (RayQueryContext *)((long)&context->scene + 1)) {
            }
          }
          uVar35 = *(ulong *)(uVar32 + (long)context * 8);
          uVar34 = (uVar34 & 0xff) - 1 & uVar34 & 0xff;
          if (uVar34 != 0) {
            uVar12 = *(uint *)(local_1108 + (long)context * 4);
            lVar29 = 0;
            if (uVar34 != 0) {
              for (; (uVar34 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
              }
            }
            uVar13 = *(ulong *)(uVar32 + lVar29 * 8);
            uVar11 = *(uint *)(local_1108 + lVar29 * 4);
            uVar34 = uVar34 - 1 & uVar34;
            context = (RayQueryContext *)(ulong)uVar34;
            uVar30 = local_1260;
            uVar37 = local_1268;
            if (uVar34 == 0) {
              if (uVar12 < uVar11) {
                *(ulong *)*pauVar28 = uVar13;
                *(uint *)((long)*pauVar28 + 8) = uVar11;
                pauVar28 = pauVar28 + 1;
              }
              else {
                *(ulong *)*pauVar28 = uVar35;
                *(uint *)((long)*pauVar28 + 8) = uVar12;
                pauVar28 = pauVar28 + 1;
                uVar35 = uVar13;
              }
            }
            else {
              auVar67._8_4_ = uVar12;
              auVar67._0_8_ = uVar35;
              auVar67._12_4_ = 0;
              auVar82._8_4_ = uVar11;
              auVar82._0_8_ = uVar13;
              auVar82._12_4_ = 0;
              lVar29 = 0;
              if (context != (RayQueryContext *)0x0) {
                for (; (uVar34 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
                }
              }
              uVar14 = *(undefined8 *)(uVar32 + lVar29 * 8);
              iVar26 = *(int *)(local_1108 + lVar29 * 4);
              auVar76._8_4_ = iVar26;
              auVar76._0_8_ = uVar14;
              auVar76._12_4_ = 0;
              auVar42._8_4_ = -(uint)((int)uVar12 < (int)uVar11);
              uVar34 = uVar34 - 1 & uVar34;
              if (uVar34 == 0) {
                auVar42._4_4_ = auVar42._8_4_;
                auVar42._0_4_ = auVar42._8_4_;
                auVar42._12_4_ = auVar42._8_4_;
                auVar85._8_4_ = uVar11;
                auVar85._0_8_ = uVar13;
                auVar85._12_4_ = 0;
                auVar65 = blendvps(auVar85,auVar67,auVar42);
                auVar118 = blendvps(auVar67,auVar82,auVar42);
                auVar43._8_4_ = -(uint)(auVar65._8_4_ < iVar26);
                auVar43._4_4_ = auVar43._8_4_;
                auVar43._0_4_ = auVar43._8_4_;
                auVar43._12_4_ = auVar43._8_4_;
                auVar83._8_4_ = iVar26;
                auVar83._0_8_ = uVar14;
                auVar83._12_4_ = 0;
                auVar84 = blendvps(auVar83,auVar65,auVar43);
                auVar86 = blendvps(auVar65,auVar76,auVar43);
                auVar44._8_4_ = -(uint)(auVar118._8_4_ < auVar86._8_4_);
                auVar44._4_4_ = auVar44._8_4_;
                auVar44._0_4_ = auVar44._8_4_;
                auVar44._12_4_ = auVar44._8_4_;
                auVar65 = blendvps(auVar86,auVar118,auVar44);
                auVar118 = blendvps(auVar118,auVar86,auVar44);
                *pauVar28 = auVar118;
                pauVar28[1] = auVar65;
                uVar35 = auVar84._0_8_;
                pauVar28 = pauVar28 + 2;
              }
              else {
                context = (RayQueryContext *)0x0;
                if (uVar34 != 0) {
                  for (; (uVar34 >> (long)context & 1) == 0;
                      context = (RayQueryContext *)((long)&context->scene + 1)) {
                  }
                }
                auVar45._4_4_ = auVar42._8_4_;
                auVar45._0_4_ = auVar42._8_4_;
                auVar45._8_4_ = auVar42._8_4_;
                auVar45._12_4_ = auVar42._8_4_;
                auVar86 = blendvps(auVar82,auVar67,auVar45);
                auVar118 = blendvps(auVar67,auVar82,auVar45);
                auVar89._8_4_ = *(int *)(local_1108 + (long)context * 4);
                auVar89._0_8_ = *(undefined8 *)(uVar32 + (long)context * 8);
                auVar89._12_4_ = 0;
                auVar46._8_4_ = -(uint)(iVar26 < *(int *)(local_1108 + (long)context * 4));
                auVar46._4_4_ = auVar46._8_4_;
                auVar46._0_4_ = auVar46._8_4_;
                auVar46._12_4_ = auVar46._8_4_;
                auVar84 = blendvps(auVar89,auVar76,auVar46);
                auVar65 = blendvps(auVar76,auVar89,auVar46);
                auVar47._8_4_ = -(uint)(auVar118._8_4_ < auVar65._8_4_);
                auVar47._4_4_ = auVar47._8_4_;
                auVar47._0_4_ = auVar47._8_4_;
                auVar47._12_4_ = auVar47._8_4_;
                auVar90 = blendvps(auVar65,auVar118,auVar47);
                auVar118 = blendvps(auVar118,auVar65,auVar47);
                auVar48._8_4_ = -(uint)(auVar86._8_4_ < auVar84._8_4_);
                auVar48._4_4_ = auVar48._8_4_;
                auVar48._0_4_ = auVar48._8_4_;
                auVar48._12_4_ = auVar48._8_4_;
                auVar65 = blendvps(auVar84,auVar86,auVar48);
                auVar86 = blendvps(auVar86,auVar84,auVar48);
                auVar49._8_4_ = -(uint)(auVar86._8_4_ < auVar90._8_4_);
                auVar49._4_4_ = auVar49._8_4_;
                auVar49._0_4_ = auVar49._8_4_;
                auVar49._12_4_ = auVar49._8_4_;
                auVar84 = blendvps(auVar90,auVar86,auVar49);
                auVar86 = blendvps(auVar86,auVar90,auVar49);
                *pauVar28 = auVar118;
                pauVar28[1] = auVar86;
                pauVar28[2] = auVar84;
                uVar35 = auVar65._0_8_;
                pauVar28 = pauVar28 + 3;
                fVar114 = local_1128;
                fVar80 = fStack_1124;
                fVar58 = fStack_1120;
                fVar63 = fStack_111c;
                fVar119 = local_1138;
                fVar69 = fStack_1134;
                fVar70 = fStack_1130;
                fVar71 = fStack_112c;
              }
            }
          }
        }
        local_1178 = (ulong)((uint)uVar35 & 0xf) - 8;
        if (local_1178 != 0) {
          uVar35 = uVar35 & 0xfffffffffffffff0;
          local_1230 = 0;
          do {
            lVar29 = local_1230 * 0x50;
            local_1170 = pRVar38->scene;
            ppfVar15 = (pRVar38->scene->vertices).items;
            pfVar16 = ppfVar15[*(uint *)(uVar35 + 0x30 + lVar29)];
            pfVar8 = pfVar16 + *(uint *)(uVar35 + lVar29);
            pfVar1 = pfVar16 + *(uint *)(uVar35 + 0x10 + lVar29);
            pfVar16 = pfVar16 + *(uint *)(uVar35 + 0x20 + lVar29);
            pfVar17 = ppfVar15[*(uint *)(uVar35 + 0x34 + lVar29)];
            pfVar2 = pfVar17 + *(uint *)(uVar35 + 4 + lVar29);
            pfVar3 = pfVar17 + *(uint *)(uVar35 + 0x14 + lVar29);
            pfVar17 = pfVar17 + *(uint *)(uVar35 + 0x24 + lVar29);
            pfVar18 = ppfVar15[*(uint *)(uVar35 + 0x38 + lVar29)];
            pfVar4 = pfVar18 + *(uint *)(uVar35 + 8 + lVar29);
            pfVar5 = pfVar18 + *(uint *)(uVar35 + 0x18 + lVar29);
            pfVar18 = pfVar18 + *(uint *)(uVar35 + 0x28 + lVar29);
            pfVar19 = ppfVar15[*(uint *)(uVar35 + 0x3c + lVar29)];
            pfVar6 = pfVar19 + *(uint *)(uVar35 + 0xc + lVar29);
            pfVar7 = pfVar19 + *(uint *)(uVar35 + 0x1c + lVar29);
            context = (RayQueryContext *)(ulong)*(uint *)(uVar35 + 0x2c + lVar29);
            pfVar19 = pfVar19 + (long)context;
            puVar9 = (undefined8 *)(uVar35 + 0x30 + lVar29);
            local_f88 = *puVar9;
            uStack_f80 = puVar9[1];
            puVar9 = (undefined8 *)(uVar35 + 0x40 + lVar29);
            local_1118 = *puVar9;
            uStack_1110 = puVar9[1];
            fVar143 = (ray->super_RayK<1>).org.field_0.m128[0];
            fVar80 = (ray->super_RayK<1>).org.field_0.m128[1];
            fVar134 = (ray->super_RayK<1>).org.field_0.m128[2];
            fVar122 = *pfVar8 - fVar143;
            fVar109 = *pfVar2 - fVar143;
            fVar132 = *pfVar4 - fVar143;
            fVar112 = *pfVar6 - fVar143;
            local_f98 = pfVar8[1] - fVar80;
            fStack_f94 = pfVar2[1] - fVar80;
            fStack_f90 = pfVar4[1] - fVar80;
            fStack_f8c = pfVar6[1] - fVar80;
            fVar63 = pfVar8[2] - fVar134;
            fVar69 = pfVar2[2] - fVar134;
            fStack_1180 = pfVar4[2] - fVar134;
            fStack_117c = pfVar6[2] - fVar134;
            fVar88 = *pfVar1 - fVar143;
            fVar92 = *pfVar3 - fVar143;
            fVar93 = *pfVar5 - fVar143;
            fVar94 = *pfVar7 - fVar143;
            fVar115 = pfVar1[1] - fVar80;
            fVar120 = pfVar3[1] - fVar80;
            fVar123 = pfVar5[1] - fVar80;
            fVar125 = pfVar7[1] - fVar80;
            fVar95 = pfVar1[2] - fVar134;
            fVar127 = pfVar3[2] - fVar134;
            fVar98 = pfVar5[2] - fVar134;
            fVar99 = pfVar7[2] - fVar134;
            fVar140 = *pfVar16 - fVar143;
            fVar141 = *pfVar17 - fVar143;
            fVar142 = *pfVar18 - fVar143;
            fVar143 = *pfVar19 - fVar143;
            fVar73 = pfVar16[1] - fVar80;
            fVar78 = pfVar17[1] - fVar80;
            fVar79 = pfVar18[1] - fVar80;
            fVar80 = pfVar19[1] - fVar80;
            fVar128 = pfVar16[2] - fVar134;
            fVar131 = pfVar17[2] - fVar134;
            fVar133 = pfVar18[2] - fVar134;
            fVar134 = pfVar19[2] - fVar134;
            fVar100 = fVar140 - fVar122;
            fVar102 = fVar141 - fVar109;
            fVar104 = fVar142 - fVar132;
            fVar106 = fVar143 - fVar112;
            fVar108 = fVar73 - local_f98;
            fVar110 = fVar78 - fStack_f94;
            fVar111 = fVar79 - fStack_f90;
            fVar113 = fVar80 - fStack_f8c;
            local_fa8 = fVar128 - fVar63;
            fStack_fa4 = fVar131 - fVar69;
            fStack_fa0 = fVar133 - fStack_1180;
            fStack_f9c = fVar134 - fStack_117c;
            local_11a8 = fVar108;
            fStack_11a4 = fVar110;
            fStack_11a0 = fVar111;
            fStack_119c = fVar113;
            local_1198._4_4_ = fVar102;
            local_1198._0_4_ = fVar100;
            fStack_1190 = fVar104;
            fStack_118c = fVar106;
            fVar62 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar81 = (ray->super_RayK<1>).dir.field_0.m128[1];
            fStack_1250 = (ray->super_RayK<1>).dir.field_0.m128[2];
            fVar114 = (fVar108 * (fVar128 + fVar63) - local_fa8 * (fVar73 + local_f98)) * fVar62 +
                      (local_fa8 * (fVar140 + fVar122) - (fVar128 + fVar63) * fVar100) * fVar81 +
                      ((fVar73 + local_f98) * fVar100 - (fVar140 + fVar122) * fVar108) * fStack_1250
            ;
            fVar58 = (fVar110 * (fVar131 + fVar69) - fStack_fa4 * (fVar78 + fStack_f94)) * fVar62 +
                     (fStack_fa4 * (fVar141 + fVar109) - (fVar131 + fVar69) * fVar102) * fVar81 +
                     ((fVar78 + fStack_f94) * fVar102 - (fVar141 + fVar109) * fVar110) * fStack_1250
            ;
            auVar50._0_8_ = CONCAT44(fVar58,fVar114);
            auVar50._8_4_ =
                 (fVar111 * (fVar133 + fStack_1180) - fStack_fa0 * (fVar79 + fStack_f90)) * fVar62 +
                 (fStack_fa0 * (fVar142 + fVar132) - (fVar133 + fStack_1180) * fVar104) * fVar81 +
                 ((fVar79 + fStack_f90) * fVar104 - (fVar142 + fVar132) * fVar111) * fStack_1250;
            auVar50._12_4_ =
                 (fVar113 * (fVar134 + fStack_117c) - fStack_f9c * (fVar80 + fStack_f8c)) * fVar62 +
                 (fStack_f9c * (fVar143 + fVar112) - (fVar134 + fStack_117c) * fVar106) * fVar81 +
                 ((fVar80 + fStack_f8c) * fVar106 - (fVar143 + fVar112) * fVar113) * fStack_1250;
            fVar135 = local_f98 - fVar115;
            fVar137 = fStack_f94 - fVar120;
            fVar138 = fStack_f90 - fVar123;
            fVar139 = fStack_f8c - fVar125;
            fVar119 = fVar63 - fVar95;
            fVar70 = fVar69 - fVar127;
            fVar71 = fStack_1180 - fVar98;
            fVar72 = fStack_117c - fVar99;
            local_1188 = (Geometry *)CONCAT44(fVar69,fVar63);
            fVar130 = fVar122 - fVar88;
            fVar103 = fVar109 - fVar92;
            fVar105 = fVar132 - fVar93;
            fVar107 = fVar112 - fVar94;
            local_fb8 = (fVar135 * (fVar63 + fVar95) - fVar119 * (local_f98 + fVar115)) * fVar62 +
                        (fVar119 * (fVar122 + fVar88) - (fVar63 + fVar95) * fVar130) * fVar81 +
                        ((local_f98 + fVar115) * fVar130 - (fVar122 + fVar88) * fVar135) *
                        fStack_1250;
            fStack_fb4 = (fVar137 * (fVar69 + fVar127) - fVar70 * (fStack_f94 + fVar120)) * fVar62 +
                         (fVar70 * (fVar109 + fVar92) - (fVar69 + fVar127) * fVar103) * fVar81 +
                         ((fStack_f94 + fVar120) * fVar103 - (fVar109 + fVar92) * fVar137) *
                         fStack_1250;
            fStack_fb0 = (fVar138 * (fStack_1180 + fVar98) - fVar71 * (fStack_f90 + fVar123)) *
                         fVar62 + (fVar71 * (fVar132 + fVar93) - (fStack_1180 + fVar98) * fVar105) *
                                  fVar81 + ((fStack_f90 + fVar123) * fVar105 -
                                           (fVar132 + fVar93) * fVar138) * fStack_1250;
            fStack_fac = (fVar139 * (fStack_117c + fVar99) - fVar72 * (fStack_f8c + fVar125)) *
                         fVar62 + (fVar72 * (fVar112 + fVar94) - (fStack_117c + fVar99) * fVar107) *
                                  fVar81 + ((fStack_f8c + fVar125) * fVar107 -
                                           (fVar112 + fVar94) * fVar139) * fStack_1250;
            local_fc8._0_4_ = fVar88 - fVar140;
            local_fc8._4_4_ = fVar92 - fVar141;
            local_fc8._8_4_ = fVar93 - fVar142;
            local_fc8._12_4_ = fVar94 - fVar143;
            local_11a8 = fVar115 - fVar73;
            fStack_11a4 = fVar120 - fVar78;
            fStack_11a0 = fVar123 - fVar79;
            fStack_119c = fVar125 - fVar80;
            fVar116 = fVar95 - fVar128;
            fVar121 = fVar127 - fVar131;
            fVar124 = fVar98 - fVar133;
            fVar126 = fVar99 - fVar134;
            local_1258 = (RTCIntersectArguments *)CONCAT44(fStack_1250,fStack_1250);
            local_11f8._8_4_ = auVar50._8_4_;
            local_11f8._0_8_ = auVar50._0_8_;
            local_11f8._12_4_ = auVar50._12_4_;
            auVar68._0_4_ =
                 (local_11a8 * (fVar128 + fVar95) - fVar116 * (fVar73 + fVar115)) * fVar62 +
                 (fVar116 * (fVar140 + fVar88) - (fVar128 + fVar95) * local_fc8._0_4_) * fVar81 +
                 ((fVar73 + fVar115) * local_fc8._0_4_ - (fVar140 + fVar88) * local_11a8) *
                 fStack_1250;
            auVar68._4_4_ =
                 (fStack_11a4 * (fVar131 + fVar127) - fVar121 * (fVar78 + fVar120)) * fVar62 +
                 (fVar121 * (fVar141 + fVar92) - (fVar131 + fVar127) * local_fc8._4_4_) * fVar81 +
                 ((fVar78 + fVar120) * local_fc8._4_4_ - (fVar141 + fVar92) * fStack_11a4) *
                 fStack_1250;
            auVar68._8_4_ =
                 (fStack_11a0 * (fVar133 + fVar98) - fVar124 * (fVar79 + fVar123)) * fVar62 +
                 (fVar124 * (fVar142 + fVar93) - (fVar133 + fVar98) * local_fc8._8_4_) * fVar81 +
                 ((fVar79 + fVar123) * local_fc8._8_4_ - (fVar142 + fVar93) * fStack_11a0) *
                 fStack_1250;
            auVar68._12_4_ =
                 (fStack_119c * (fVar134 + fVar99) - fVar126 * (fVar80 + fVar125)) * fVar62 +
                 (fVar126 * (fVar143 + fVar94) - (fVar134 + fVar99) * local_fc8._12_4_) * fVar81 +
                 ((fVar80 + fVar125) * local_fc8._12_4_ - (fVar143 + fVar94) * fStack_119c) *
                 fStack_1250;
            local_1198._0_4_ = fVar114 + local_fb8 + auVar68._0_4_;
            local_1198._4_4_ = fVar58 + fStack_fb4 + auVar68._4_4_;
            fStack_1190 = auVar50._8_4_ + fStack_fb0 + auVar68._8_4_;
            fStack_118c = auVar50._12_4_ + fStack_fac + auVar68._12_4_;
            auVar22._4_4_ = fStack_fb4;
            auVar22._0_4_ = local_fb8;
            auVar22._8_4_ = fStack_fb0;
            auVar22._12_4_ = fStack_fac;
            auVar118 = minps(auVar50,auVar22);
            auVar118 = minps(auVar118,auVar68);
            auVar23._4_4_ = fStack_fb4;
            auVar23._0_4_ = local_fb8;
            auVar23._8_4_ = fStack_fb0;
            auVar23._12_4_ = fStack_fac;
            auVar117 = maxps(local_11f8,auVar23);
            auVar117 = maxps(auVar117,auVar68);
            fVar143 = ABS((float)local_1198._0_4_) * 1.1920929e-07;
            fVar80 = ABS((float)local_1198._4_4_) * 1.1920929e-07;
            fVar134 = ABS(fStack_1190) * 1.1920929e-07;
            fVar73 = ABS(fStack_118c) * 1.1920929e-07;
            local_1269 = 0;
            auVar96._0_4_ =
                 -(uint)(auVar117._0_4_ <= fVar143 || -fVar143 <= auVar118._0_4_) & local_fd8;
            auVar96._4_4_ =
                 -(uint)(auVar117._4_4_ <= fVar80 || -fVar80 <= auVar118._4_4_) & uStack_fd4;
            auVar96._8_4_ =
                 -(uint)(auVar117._8_4_ <= fVar134 || -fVar134 <= auVar118._8_4_) & uStack_fd0;
            auVar96._12_4_ =
                 -(uint)(auVar117._12_4_ <= fVar73 || -fVar73 <= auVar118._12_4_) & uStack_fcc;
            iVar26 = movmskps((int)lVar29,auVar96);
            if (iVar26 != 0) {
              auVar136._0_4_ = fVar135 * fVar116 - fVar119 * local_11a8;
              auVar136._4_4_ = fVar137 * fVar121 - fVar70 * fStack_11a4;
              auVar136._8_4_ = fVar138 * fVar124 - fVar71 * fStack_11a0;
              auVar136._12_4_ = fVar139 * fVar126 - fVar72 * fStack_119c;
              auVar51._4_4_ = -(uint)(ABS(fStack_fa4 * fVar137) < ABS(fVar70 * fStack_11a4));
              auVar51._0_4_ = -(uint)(ABS(local_fa8 * fVar135) < ABS(fVar119 * local_11a8));
              auVar51._8_4_ = -(uint)(ABS(fStack_fa0 * fVar138) < ABS(fVar71 * fStack_11a0));
              auVar51._12_4_ = -(uint)(ABS(fStack_f9c * fVar139) < ABS(fVar72 * fStack_119c));
              auVar21._4_4_ = fVar110 * fVar70 - fStack_fa4 * fVar137;
              auVar21._0_4_ = fVar108 * fVar119 - local_fa8 * fVar135;
              auVar21._8_4_ = fVar111 * fVar71 - fStack_fa0 * fVar138;
              auVar21._12_4_ = fVar113 * fVar72 - fStack_f9c * fVar139;
              local_1088 = blendvps(auVar136,auVar21,auVar51);
              auVar91._0_4_ = fVar119 * local_fc8._0_4_ - fVar130 * fVar116;
              auVar91._4_4_ = fVar70 * local_fc8._4_4_ - fVar103 * fVar121;
              auVar91._8_4_ = fVar71 * local_fc8._8_4_ - fVar105 * fVar124;
              auVar91._12_4_ = fVar72 * local_fc8._12_4_ - fVar107 * fVar126;
              auVar52._4_4_ = -(uint)(ABS(fVar102 * fVar70) < ABS(fVar103 * fVar121));
              auVar52._0_4_ = -(uint)(ABS(fVar100 * fVar119) < ABS(fVar130 * fVar116));
              auVar52._8_4_ = -(uint)(ABS(fVar104 * fVar71) < ABS(fVar105 * fVar124));
              auVar52._12_4_ = -(uint)(ABS(fVar106 * fVar72) < ABS(fVar107 * fVar126));
              auVar24._4_4_ = fStack_fa4 * fVar103 - fVar102 * fVar70;
              auVar24._0_4_ = local_fa8 * fVar130 - fVar100 * fVar119;
              auVar24._8_4_ = fStack_fa0 * fVar105 - fVar104 * fVar71;
              auVar24._12_4_ = fStack_f9c * fVar107 - fVar106 * fVar72;
              local_1078 = blendvps(auVar91,auVar24,auVar52);
              auVar87._0_4_ = fVar100 * fVar135 - fVar108 * fVar130;
              auVar87._4_4_ = fVar102 * fVar137 - fVar110 * fVar103;
              auVar87._8_4_ = fVar104 * fVar138 - fVar111 * fVar105;
              auVar87._12_4_ = fVar106 * fVar139 - fVar113 * fVar107;
              auVar101._0_4_ = fVar130 * local_11a8 - fVar135 * local_fc8._0_4_;
              auVar101._4_4_ = fVar103 * fStack_11a4 - fVar137 * local_fc8._4_4_;
              auVar101._8_4_ = fVar105 * fStack_11a0 - fVar138 * local_fc8._8_4_;
              auVar101._12_4_ = fVar107 * fStack_119c - fVar139 * local_fc8._12_4_;
              auVar53._4_4_ = -(uint)(ABS(fVar110 * fVar103) < ABS(fVar137 * local_fc8._4_4_));
              auVar53._0_4_ = -(uint)(ABS(fVar108 * fVar130) < ABS(fVar135 * local_fc8._0_4_));
              auVar53._8_4_ = -(uint)(ABS(fVar111 * fVar105) < ABS(fVar138 * local_fc8._8_4_));
              auVar53._12_4_ = -(uint)(ABS(fVar113 * fVar107) < ABS(fVar139 * local_fc8._12_4_));
              local_1068 = blendvps(auVar101,auVar87,auVar53);
              fVar143 = fVar62 * local_1088._0_4_ +
                        fVar81 * local_1078._0_4_ + fStack_1250 * local_1068._0_4_;
              fVar80 = fVar62 * local_1088._4_4_ +
                       fVar81 * local_1078._4_4_ + fStack_1250 * local_1068._4_4_;
              fVar134 = fVar62 * local_1088._8_4_ +
                        fVar81 * local_1078._8_4_ + fStack_1250 * local_1068._8_4_;
              fVar62 = fVar62 * local_1088._12_4_ +
                       fVar81 * local_1078._12_4_ + fStack_1250 * local_1068._12_4_;
              auVar59._0_4_ = fVar143 + fVar143;
              auVar59._4_4_ = fVar80 + fVar80;
              auVar59._8_4_ = fVar134 + fVar134;
              auVar59._12_4_ = fVar62 + fVar62;
              auVar54._0_4_ = fVar63 * local_1068._0_4_;
              auVar54._4_4_ = fVar69 * local_1068._4_4_;
              auVar54._8_4_ = fStack_1180 * local_1068._8_4_;
              auVar54._12_4_ = fStack_117c * local_1068._12_4_;
              fVar81 = fVar122 * local_1088._0_4_ + local_f98 * local_1078._0_4_ + auVar54._0_4_;
              fVar63 = fVar109 * local_1088._4_4_ + fStack_f94 * local_1078._4_4_ + auVar54._4_4_;
              fVar119 = fVar132 * local_1088._8_4_ + fStack_f90 * local_1078._8_4_ + auVar54._8_4_;
              fVar69 = fVar112 * local_1088._12_4_ + fStack_f8c * local_1078._12_4_ + auVar54._12_4_
              ;
              auVar118 = rcpps(auVar54,auVar59);
              fVar143 = auVar118._0_4_;
              fVar80 = auVar118._4_4_;
              fVar134 = auVar118._8_4_;
              fVar62 = auVar118._12_4_;
              local_1248._0_4_ =
                   ((1.0 - auVar59._0_4_ * fVar143) * fVar143 + fVar143) * (fVar81 + fVar81);
              local_1248._4_4_ =
                   ((1.0 - auVar59._4_4_ * fVar80) * fVar80 + fVar80) * (fVar63 + fVar63);
              local_1248._8_4_ =
                   ((1.0 - auVar59._8_4_ * fVar134) * fVar134 + fVar134) * (fVar119 + fVar119);
              local_1248._12_4_ =
                   ((1.0 - auVar59._12_4_ * fVar62) * fVar62 + fVar62) * (fVar69 + fVar69);
              local_1228._0_4_ = (ray->super_RayK<1>).tfar;
              local_1228._4_4_ = (ray->super_RayK<1>).mask;
              local_1228._8_4_ = (ray->super_RayK<1>).id;
              local_1228._12_4_ = (ray->super_RayK<1>).flags;
              fVar143 = (ray->super_RayK<1>).org.field_0.m128[3];
              auVar55._4_4_ = -(uint)(fVar143 <= local_1248._4_4_);
              auVar55._0_4_ = -(uint)(fVar143 <= local_1248._0_4_);
              auVar55._8_4_ = -(uint)(fVar143 <= local_1248._8_4_);
              auVar55._12_4_ = -(uint)(fVar143 <= local_1248._12_4_);
              auVar60._0_4_ =
                   (int)((uint)(auVar59._0_4_ != 0.0 &&
                               (local_1248._0_4_ <= (float)local_1228._0_4_ &&
                               fVar143 <= local_1248._0_4_)) * -0x80000000) >> 0x1f;
              auVar60._4_4_ =
                   (int)((uint)(auVar59._4_4_ != 0.0 &&
                               (local_1248._4_4_ <= (float)local_1228._0_4_ &&
                               fVar143 <= local_1248._4_4_)) * -0x80000000) >> 0x1f;
              auVar60._8_4_ =
                   (int)((uint)(auVar59._8_4_ != 0.0 &&
                               (local_1248._8_4_ <= (float)local_1228._0_4_ &&
                               fVar143 <= local_1248._8_4_)) * -0x80000000) >> 0x1f;
              auVar60._12_4_ =
                   (int)((uint)(auVar59._12_4_ != 0.0 &&
                               (local_1248._12_4_ <= (float)local_1228._0_4_ &&
                               fVar143 <= local_1248._12_4_)) * -0x80000000) >> 0x1f;
              auVar61 = auVar60 & auVar96;
              iVar26 = movmskps(iVar26,auVar61);
              if (iVar26 != 0) {
                local_1108._8_4_ = auVar50._8_4_;
                local_1108._0_8_ = auVar50._0_8_;
                fStack_10fc = auVar50._12_4_;
                local_10f8 = local_fb8;
                fStack_10f4 = fStack_fb4;
                fStack_10f0 = fStack_fb0;
                fStack_10ec = fStack_fac;
                local_10e8 = _local_1198;
                local_10d8 = &local_1269;
                local_10c8 = auVar61;
                local_1098 = local_1248;
                local_11e8 = auVar61;
                auVar118 = rcpps(auVar55,_local_1198);
                fVar143 = auVar118._0_4_;
                fVar80 = auVar118._4_4_;
                fVar134 = auVar118._8_4_;
                fVar62 = auVar118._12_4_;
                fVar143 = (float)(-(uint)(1e-18 <= ABS((float)local_1198._0_4_)) &
                                 (uint)(((float)DAT_01f7ba10 - (float)local_1198._0_4_ * fVar143) *
                                        fVar143 + fVar143));
                fVar80 = (float)(-(uint)(1e-18 <= ABS((float)local_1198._4_4_)) &
                                (uint)((DAT_01f7ba10._4_4_ - (float)local_1198._4_4_ * fVar80) *
                                       fVar80 + fVar80));
                fVar134 = (float)(-(uint)(1e-18 <= ABS(fStack_1190)) &
                                 (uint)((DAT_01f7ba10._8_4_ - fStack_1190 * fVar134) * fVar134 +
                                       fVar134));
                fVar62 = (float)(-(uint)(1e-18 <= ABS(fStack_118c)) &
                                (uint)((DAT_01f7ba10._12_4_ - fStack_118c * fVar62) * fVar62 +
                                      fVar62));
                auVar97._0_4_ = fVar114 * fVar143;
                auVar97._4_4_ = fVar58 * fVar80;
                auVar97._8_4_ = auVar50._8_4_ * fVar134;
                auVar97._12_4_ = auVar50._12_4_ * fVar62;
                local_10b8 = minps(auVar97,_DAT_01f7ba10);
                auVar129._0_4_ = fVar143 * local_fb8;
                auVar129._4_4_ = fVar80 * fStack_fb4;
                auVar129._8_4_ = fVar134 * fStack_fb0;
                auVar129._12_4_ = fVar62 * fStack_fac;
                local_10a8 = minps(auVar129,_DAT_01f7ba10);
                auVar117 = blendvps(_DAT_01f7a9f0,local_1248,auVar61);
                auVar77._4_4_ = auVar117._0_4_;
                auVar77._0_4_ = auVar117._4_4_;
                auVar77._8_4_ = auVar117._12_4_;
                auVar77._12_4_ = auVar117._8_4_;
                auVar118 = minps(auVar77,auVar117);
                auVar56._0_8_ = auVar118._8_8_;
                auVar56._8_4_ = auVar118._0_4_;
                auVar56._12_4_ = auVar118._4_4_;
                auVar118 = minps(auVar56,auVar118);
                auVar57._0_8_ =
                     CONCAT44(-(uint)(auVar118._4_4_ == auVar117._4_4_) & auVar61._4_4_,
                              -(uint)(auVar118._0_4_ == auVar117._0_4_) & auVar61._0_4_);
                auVar57._8_4_ = -(uint)(auVar118._8_4_ == auVar117._8_4_) & auVar61._8_4_;
                auVar57._12_4_ = -(uint)(auVar118._12_4_ == auVar117._12_4_) & auVar61._12_4_;
                iVar26 = movmskps((int)&local_1269,auVar57);
                if (iVar26 != 0) {
                  auVar61._8_4_ = auVar57._8_4_;
                  auVar61._0_8_ = auVar57._0_8_;
                  auVar61._12_4_ = auVar57._12_4_;
                }
                context = (RayQueryContext *)extractps(local_1228,1);
                uVar27 = movmskps(iVar26,auVar61);
                uVar30 = CONCAT44((int)((ulong)&local_1269 >> 0x20),uVar27);
                pRVar36 = (RayHit *)0x0;
                fStack_124c = fStack_1250;
                if (uVar30 != 0) {
                  for (; (uVar30 >> (long)pRVar36 & 1) == 0;
                      pRVar36 = (RayHit *)((long)(pRVar36->super_RayK<1>).org.field_0.m128 + 1)) {
                  }
                }
                do {
                  uVar34 = *(uint *)((long)&local_f88 + (long)pRVar36 * 4);
                  pGVar20 = (local_1170->geometries).items[uVar34].ptr;
                  if ((pGVar20->mask & (uint)context) == 0) {
                    *(undefined4 *)(local_11e8 + (long)pRVar36 * 4) = 0;
                  }
                  else {
                    local_1258 = pRVar38->args;
                    if (local_1258->filter == (RTCFilterFunctionN)0x0) {
                      pRVar33 = pRVar38->user;
                      if (pGVar20->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        fVar143 = *(float *)(local_10b8 + (long)pRVar36 * 4);
                        fVar80 = *(float *)(local_10a8 + (long)pRVar36 * 4);
                        (ray->super_RayK<1>).tfar = *(float *)(local_1098 + (long)pRVar36 * 4);
                        (ray->Ng).field_0.field_0.x = *(float *)(local_1088 + (long)pRVar36 * 4);
                        (ray->Ng).field_0.field_0.y = *(float *)(local_1078 + (long)pRVar36 * 4);
                        (ray->Ng).field_0.field_0.z = *(float *)(local_1068 + (long)pRVar36 * 4);
                        ray->u = fVar143;
                        ray->v = fVar80;
                        uVar12 = *(uint *)((long)&local_1118 + (long)pRVar36 * 4);
                        context = (RayQueryContext *)(ulong)uVar12;
                        ray->primID = uVar12;
                        ray->geomID = uVar34;
                        ray->instID[0] = pRVar33->instID[0];
                        ray->instPrimID[0] = pRVar33->instPrimID[0];
                        break;
                      }
                    }
                    else {
                      pRVar33 = pRVar38->user;
                    }
                    local_1168 = *(float *)(local_1088 + (long)pRVar36 * 4);
                    local_1164 = *(undefined4 *)(local_1078 + (long)pRVar36 * 4);
                    local_1160 = *(undefined4 *)(local_1068 + (long)pRVar36 * 4);
                    local_115c = *(undefined4 *)(local_10b8 + (long)pRVar36 * 4);
                    local_1158 = *(undefined4 *)(local_10a8 + (long)pRVar36 * 4);
                    local_1154 = *(undefined4 *)((long)&local_1118 + (long)pRVar36 * 4);
                    local_1150 = uVar34;
                    local_114c = pRVar33->instID[0];
                    local_1148 = pRVar33->instPrimID[0];
                    (ray->super_RayK<1>).tfar = *(float *)(local_1098 + (long)pRVar36 * 4);
                    local_11fc = (undefined1  [4])0xffffffff;
                    local_11d8.valid = (int *)local_11fc;
                    local_11d8.geometryUserPtr = pGVar20->userPtr;
                    local_11d8.context = pRVar33;
                    local_11d8.ray = (RTCRayN *)ray;
                    local_11d8.hit = (RTCHitN *)&local_1168;
                    local_11d8.N = 1;
                    local_1188 = pGVar20;
                    local_11f8._0_8_ = pRVar36;
                    if (pGVar20->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00d910ec:
                      if ((local_1258->filter != (RTCFilterFunctionN)0x0) &&
                         (((local_1258->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((local_1188->field_8).field_0x2 & 0x40) != 0)))) {
                        (*local_1258->filter)(&local_11d8);
                        pRVar36 = (RayHit *)local_11f8._0_8_;
                        uVar37 = local_1268;
                        pRVar38 = local_1208;
                        ray = local_1210;
                        if ((((RayK<1> *)local_11d8.valid)->org).field_0.m128[0] == 0.0)
                        goto LAB_00d911a5;
                      }
                      (((Vec3f *)((long)local_11d8.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_11d8.hit;
                      (((Vec3f *)((long)local_11d8.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_11d8.hit + 4);
                      (((Vec3f *)((long)local_11d8.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_11d8.hit + 8);
                      *(float *)((long)local_11d8.ray + 0x3c) = *(float *)(local_11d8.hit + 0xc);
                      *(float *)((long)local_11d8.ray + 0x40) = *(float *)(local_11d8.hit + 0x10);
                      *(float *)((long)local_11d8.ray + 0x44) = *(float *)(local_11d8.hit + 0x14);
                      *(float *)((long)local_11d8.ray + 0x48) = *(float *)(local_11d8.hit + 0x18);
                      *(float *)((long)local_11d8.ray + 0x4c) = *(float *)(local_11d8.hit + 0x1c);
                      *(float *)((long)local_11d8.ray + 0x50) = *(float *)(local_11d8.hit + 0x20);
                      pRVar31 = (RayHit *)local_11d8.ray;
                    }
                    else {
                      (*pGVar20->intersectionFilterN)(&local_11d8);
                      pRVar36 = (RayHit *)local_11f8._0_8_;
                      uVar37 = local_1268;
                      pRVar38 = local_1208;
                      ray = local_1210;
                      if ((((RayK<1> *)local_11d8.valid)->org).field_0.m128[0] != 0.0)
                      goto LAB_00d910ec;
LAB_00d911a5:
                      (local_1210->super_RayK<1>).tfar = (float)local_1228._0_4_;
                      pRVar31 = (RayHit *)local_11d8.valid;
                      pRVar36 = (RayHit *)local_11f8._0_8_;
                      uVar37 = local_1268;
                      pRVar38 = local_1208;
                      ray = local_1210;
                    }
                    uVar34 = (uint)pRVar31;
                    *(undefined4 *)(local_11e8 + (long)pRVar36 * 4) = 0;
                    local_1228._0_4_ = (ray->super_RayK<1>).tfar;
                    local_1228._4_4_ = (ray->super_RayK<1>).mask;
                    local_1228._8_4_ = (ray->super_RayK<1>).id;
                    local_1228._12_4_ = (ray->super_RayK<1>).flags;
                    local_11e8._0_4_ =
                         -(uint)(local_1248._0_4_ <= (float)local_1228._0_4_) & local_11e8._0_4_;
                    local_11e8._4_4_ =
                         -(uint)(local_1248._4_4_ <= (float)local_1228._0_4_) & local_11e8._4_4_;
                    local_11e8._8_4_ =
                         -(uint)(local_1248._8_4_ <= (float)local_1228._0_4_) & local_11e8._8_4_;
                    local_11e8._12_4_ =
                         -(uint)(local_1248._12_4_ <= (float)local_1228._0_4_) & local_11e8._12_4_;
                    context = (RayQueryContext *)extractps(local_1228,1);
                  }
                  iVar26 = movmskps(uVar34,local_11e8);
                  if (iVar26 == 0) break;
                  local_1258 = (RTCIntersectArguments *)CONCAT44(local_1258._4_4_,(int)context);
                  BVHNIntersector1<4,1,true,embree::sse42::ArrayIntersector1<embree::sse42::TriangleMiIntersector1Pluecker<4,true>>>
                  ::intersect();
                  context = (RayQueryContext *)((ulong)local_1258 & 0xffffffff);
                  pRVar36 = (RayHit *)local_11d8.valid;
                  uVar37 = local_1268;
                  pRVar38 = local_1208;
                  ray = local_1210;
                } while( true );
              }
            }
            local_1230 = local_1230 + 1;
          } while (local_1230 != local_1178);
        }
        fVar143 = (ray->super_RayK<1>).tfar;
        auVar117._4_4_ = fVar143;
        auVar117._0_4_ = fVar143;
        auVar117._8_4_ = fVar143;
        auVar117._12_4_ = fVar143;
        uVar30 = local_1260;
        fVar72 = local_ff8;
        fVar73 = fStack_ff4;
        fVar78 = fStack_ff0;
        fVar143 = fStack_fec;
        fVar79 = local_1038;
        fVar88 = fStack_1034;
        fVar92 = fStack_1030;
        fVar62 = fStack_102c;
        fVar93 = local_1048;
        fVar94 = fStack_1044;
        fVar95 = fStack_1040;
        fVar127 = fStack_103c;
        fVar98 = local_1058;
        fVar99 = fStack_1054;
        fVar100 = fStack_1050;
        fVar130 = fStack_104c;
        fVar114 = local_1128;
        fVar80 = fStack_1124;
        fVar58 = fStack_1120;
        fVar63 = fStack_111c;
        fVar119 = local_1138;
        fVar69 = fStack_1134;
        fVar70 = fStack_1130;
        fVar71 = fStack_112c;
        fVar102 = local_fe8;
        fVar103 = fStack_fe4;
        fVar104 = fStack_fe0;
        fVar81 = fStack_fdc;
        fVar105 = local_1008;
        fVar106 = fStack_1004;
        fVar107 = fStack_1000;
        fVar122 = fStack_ffc;
        fVar108 = local_1018;
        fVar109 = fStack_1014;
        fVar110 = fStack_1010;
        fVar132 = fStack_100c;
        fVar111 = local_1028;
        fVar112 = fStack_1024;
        fVar113 = fStack_1020;
        fVar134 = fStack_101c;
      }
    } while (pauVar28 != (undefined1 (*) [16])&local_f78);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }